

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64_t __thiscall
google::protobuf::internal::ThreadSafeArena::SpaceAllocated(ThreadSafeArena *this)

{
  uint64_t uVar1;
  uint64_t local_20;
  uint64_t res;
  SerialArena *serial;
  ThreadSafeArena *this_local;
  
  res = (uint64_t)
        std::atomic<google::protobuf::internal::SerialArena_*>::load
                  ((atomic<google::protobuf::internal::SerialArena_*> *)(this + 0x10),
                   memory_order_acquire);
  local_20 = 0;
  for (; res != 0; res = (uint64_t)SerialArena::next((SerialArena *)res)) {
    uVar1 = SerialArena::SpaceAllocated((SerialArena *)res);
    local_20 = uVar1 + local_20;
  }
  return local_20;
}

Assistant:

uint64_t ThreadSafeArena::SpaceAllocated() const {
  SerialArena* serial = threads_.load(std::memory_order_acquire);
  uint64_t res = 0;
  for (; serial; serial = serial->next()) {
    res += serial->SpaceAllocated();
  }
  return res;
}